

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_indexed_child_t art_node48_lower_bound(art_node48_t *node,art_key_chunk_t key_chunk)

{
  art_indexed_child_t aVar1;
  size_t i;
  art_key_chunk_t key_chunk_local;
  art_node48_t *node_local;
  art_indexed_child_t indexed_child;
  
  i = (size_t)key_chunk;
  do {
    if (0xff < i) {
      indexed_child.child = 0;
LAB_00111c75:
      aVar1.index = indexed_child.index;
      aVar1.child = indexed_child.child;
      aVar1.key_chunk = indexed_child.key_chunk;
      aVar1._10_6_ = indexed_child._10_6_;
      return aVar1;
    }
    if (*(char *)((long)&node->field_0 + i + 0x10) != '0') {
      indexed_child.index = (uint8_t)i;
      indexed_child.child =
           *(art_ref_t *)
            ((long)&node->field_0 + (ulong)*(byte *)((long)&node->field_0 + i + 0x10) * 8 + 0x110);
      indexed_child.key_chunk = indexed_child.index;
      goto LAB_00111c75;
    }
    i = i + 1;
  } while( true );
}

Assistant:

static inline art_indexed_child_t art_node48_lower_bound(
    art_node48_t *node, art_key_chunk_t key_chunk) {
    art_indexed_child_t indexed_child;
    for (size_t i = key_chunk; i < 256; ++i) {
        if (node->keys[i] != CROARING_ART_NODE48_EMPTY_VAL) {
            indexed_child.index = i;
            indexed_child.child = node->children[node->keys[i]];
            indexed_child.key_chunk = i;
            return indexed_child;
        }
    }
    indexed_child.child = CROARING_ART_NULL_REF;
    return indexed_child;
}